

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraph.cpp
# Opt level: O0

bool dg::array_match(StringRef name,char **names)

{
  StringRef RHS;
  bool bVar1;
  StringRef *in_RDX;
  uint idx;
  StringRef *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar2;
  
  uVar2 = 0;
  while( true ) {
    if ((&in_RDX->Data)[uVar2] == (char *)0x0) {
      return false;
    }
    llvm::StringRef::StringRef(in_RDX,(char *)CONCAT44(uVar2,in_stack_ffffffffffffffd8));
    RHS.Data._4_4_ = uVar2;
    RHS.Data._0_4_ = in_stack_ffffffffffffffd8;
    RHS.Length = (size_t)in_RDX;
    bVar1 = llvm::StringRef::equals(in_stack_ffffffffffffffd0,RHS);
    if (bVar1) break;
    uVar2 = uVar2 + 1;
  }
  return true;
}

Assistant:

static bool array_match(llvm::StringRef name, const char *names[]) {
    unsigned idx = 0;
    while (names[idx]) {
        if (name.equals(names[idx]))
            return true;
        ++idx;
    }

    return false;
}